

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::StringPtr>(char *target,StringPtr *first)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  
  pcVar1 = (first->content).ptr;
  sVar2 = (first->content).size_;
  for (lVar3 = 0; sVar2 - 1 != lVar3; lVar3 = lVar3 + 1) {
    target[lVar3] = pcVar1[lVar3];
  }
  return target + lVar3;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}